

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall
QByteArray::replace(QByteArray *this,QByteArrayView before,QByteArrayView after)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  qsizetype qVar4;
  long lVar5;
  size_t __n2;
  char *pcVar6;
  _Alloc_hider __s;
  char *pcVar7;
  long lVar8;
  size_type __n2_00;
  _Alloc_hider __s_00;
  size_t __n;
  long lVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QByteArrayView data;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  QByteArrayView data_03;
  size_t indices [4096];
  QByteArrayMatcher matcher;
  long local_84e0;
  long local_84d0;
  qsizetype local_8498 [4096];
  QByteArrayMatcher local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  __s._M_p = before.m_data;
  __n2_00 = before.m_size;
  __s_00._M_p = after.m_data;
  __n2 = after.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->d).size;
  if (lVar2 == 0) {
    if (__n2_00 != 0) goto LAB_001556b0;
  }
  else if (__n2 == __n2_00 && __s._M_p == __s_00._M_p) goto LAB_001556b0;
  if (__n2_00 != 0 || __n2 != 0) {
    if (__n2 == 1 && __n2_00 == 1) {
      replace(this,*__s._M_p,*__s_00._M_p);
    }
    else {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._M_string_length = 0;
      local_78.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
      pcVar6 = (this->d).ptr;
      if (__s_00._M_p < pcVar6 + lVar2 && pcVar6 <= __s_00._M_p) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (&local_78,0,0,__s_00._M_p,__n2);
        pcVar6 = (this->d).ptr;
        lVar2 = (this->d).size;
        __s_00._M_p = local_78._M_dataplus._M_p;
      }
      if ((pcVar6 <= __s._M_p) && (__s._M_p < pcVar6 + lVar2)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                  (&local_58,0,local_58._M_string_length,__s._M_p,__n2_00);
        __s._M_p = local_58._M_dataplus._M_p;
      }
      memset(&local_498,0xaa,0x420);
      QByteArrayMatcher::QByteArrayMatcher(&local_498,__s._M_p,__n2_00);
      pDVar1 = (this->d).d;
      lVar2 = (this->d).size;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        reallocData(this,lVar2,KeepSize);
      }
      pcVar6 = (this->d).ptr;
      lVar3 = __n2 - __n2_00;
      if (lVar3 == 0) {
        if ((__n2_00 != 0) &&
           (data.m_data = pcVar6, data.m_size = (this->d).size,
           qVar4 = QByteArrayMatcher::indexIn(&local_498,data,0), qVar4 != -1)) {
          do {
            memcpy(pcVar6 + qVar4,__s_00._M_p,__n2_00);
            data_00.m_data = (this->d).ptr;
            data_00.m_size = (this->d).size;
            qVar4 = QByteArrayMatcher::indexIn(&local_498,data_00,qVar4 + __n2_00);
          } while (qVar4 != -1);
        }
      }
      else if ((long)__n2 < (long)__n2_00) {
        data_01.m_data = pcVar6;
        data_01.m_size = (this->d).size;
        lVar5 = QByteArrayMatcher::indexIn(&local_498,data_01,0);
        if (lVar5 != -1) {
          local_84d0 = 0;
          lVar8 = 0;
          local_84e0 = 0;
          lVar10 = lVar2;
          do {
            bVar11 = local_84d0 != 0;
            local_84d0 = local_84d0 + -1;
            lVar9 = lVar5;
            if ((bVar11) && (__n = lVar5 - lVar8, lVar9 = local_84e0, 0 < (long)__n)) {
              memmove(pcVar6 + local_84e0,pcVar6 + lVar8,__n);
              lVar9 = __n + local_84e0;
            }
            if (0 < (long)__n2) {
              memcpy(pcVar6 + lVar9,__s_00._M_p,__n2);
              lVar9 = lVar9 + __n2;
            }
            lVar8 = lVar5 + __n2_00;
            data_02.m_data = (this->d).ptr;
            data_02.m_size = (this->d).size;
            lVar5 = QByteArrayMatcher::indexIn(&local_498,data_02,lVar8);
            lVar10 = lVar10 + lVar3;
            local_84e0 = lVar9;
          } while (lVar5 != -1);
          if (local_84d0 != 0) {
            if (0 < lVar2 - lVar8) {
              memmove(pcVar6 + lVar9,pcVar6 + lVar8,lVar2 - lVar8);
            }
            resize(this,lVar10);
          }
        }
      }
      else {
        lVar5 = 0;
        do {
          memset(local_8498,0xaa,0x8000);
          lVar10 = 0;
          lVar8 = 0;
          do {
            data_03.m_data = (this->d).ptr;
            data_03.m_size = (this->d).size;
            qVar4 = QByteArrayMatcher::indexIn(&local_498,data_03,lVar5);
            if (qVar4 == -1) {
              lVar5 = -1;
              if (lVar8 == 0) goto LAB_00155659;
              goto LAB_001555d0;
            }
            local_8498[lVar8] = qVar4;
            lVar8 = lVar8 + 1;
            lVar5 = qVar4 + __n2_00 + (__n2_00 == 0);
            lVar10 = lVar10 + lVar3;
          } while (lVar8 != 0xfff);
          if (lVar5 != -1) {
            lVar5 = lVar3 * 0xfff + lVar5;
          }
          lVar8 = 0xfff;
          lVar10 = lVar3 * 0xfff;
LAB_001555d0:
          lVar9 = lVar2;
          if (0 < lVar10) {
            lVar9 = lVar10 + lVar2;
            resize(this,lVar9);
          }
          pcVar6 = (this->d).ptr;
          lVar8 = lVar8 + -1;
          pcVar7 = pcVar6 + lVar3 * lVar8;
          do {
            lVar10 = local_8498[lVar8];
            memmove(pcVar7 + lVar10 + __n2,pcVar6 + __n2_00 + lVar10,lVar2 - (__n2_00 + lVar10));
            if (__n2 != 0) {
              memcpy(pcVar7 + lVar10,__s_00._M_p,__n2);
            }
            pcVar7 = pcVar7 + (__n2_00 - __n2);
            bVar11 = lVar8 != 0;
            lVar8 = lVar8 + -1;
            lVar2 = lVar10;
          } while (bVar11);
          lVar2 = lVar9;
        } while (lVar5 != -1);
      }
LAB_00155659:
      QByteArrayMatcher::~QByteArrayMatcher(&local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_001556b0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QByteArray &QByteArray::replace(QByteArrayView before, QByteArrayView after)
{
    const char *b = before.data();
    qsizetype bsize = before.size();
    const char *a = after.data();
    qsizetype asize = after.size();

    if (isEmpty()) {
        if (bsize)
            return *this;
    } else {
        if (b == a && bsize == asize)
            return *this;
    }
    if (asize == 0 && bsize == 0)
        return *this;

    if (bsize == 1 && asize == 1)
        return replace(*b, *a); // use the fast char-char algorithm

    // protect against before or after being part of this
    std::string pinnedNeedle, pinnedReplacement;
    if (QtPrivate::q_points_into_range(a, d)) {
        pinnedReplacement.assign(a, a + asize);
        a = pinnedReplacement.data();
    }
    if (QtPrivate::q_points_into_range(b, d)) {
        pinnedNeedle.assign(b, b + bsize);
        b = pinnedNeedle.data();
    }

    QByteArrayMatcher matcher(b, bsize);
    qsizetype index = 0;
    qsizetype len = size();
    char *d = data(); // detaches

    if (bsize == asize) {
        if (bsize) {
            while ((index = matcher.indexIn(*this, index)) != -1) {
                memcpy(d + index, a, asize);
                index += bsize;
            }
        }
    } else if (asize < bsize) {
        size_t to = 0;
        size_t movestart = 0;
        size_t num = 0;
        while ((index = matcher.indexIn(*this, index)) != -1) {
            if (num) {
                qsizetype msize = index - movestart;
                if (msize > 0) {
                    memmove(d + to, d + movestart, msize);
                    to += msize;
                }
            } else {
                to = index;
            }
            if (asize > 0) {
                memcpy(d + to, a, asize);
                to += asize;
            }
            index += bsize;
            movestart = index;
            num++;
        }
        if (num) {
            qsizetype msize = len - movestart;
            if (msize > 0)
                memmove(d + to, d + movestart, msize);
            resize(len - num*(bsize-asize));
        }
    } else {
        // the most complex case. We don't want to lose performance by doing repeated
        // copies and reallocs of the data.
        while (index != -1) {
            size_t indices[4096];
            size_t pos = 0;
            while(pos < 4095) {
                index = matcher.indexIn(*this, index);
                if (index == -1)
                    break;
                indices[pos++] = index;
                index += bsize;
                // avoid infinite loop
                if (!bsize)
                    index++;
            }
            if (!pos)
                break;

            // we have a table of replacement positions, use them for fast replacing
            qsizetype adjust = pos*(asize-bsize);
            // index has to be adjusted in case we get back into the loop above.
            if (index != -1)
                index += adjust;
            qsizetype newlen = len + adjust;
            qsizetype moveend = len;
            if (newlen > len) {
                resize(newlen);
                len = newlen;
            }
            d = this->d.data(); // data(), without the detach() check

            while(pos) {
                pos--;
                qsizetype movestart = indices[pos] + bsize;
                qsizetype insertstart = indices[pos] + pos*(asize-bsize);
                qsizetype moveto = insertstart + asize;
                memmove(d + moveto, d + movestart, (moveend - movestart));
                if (asize)
                    memcpy(d + insertstart, a, asize);
                moveend = movestart - bsize;
            }
        }
    }
    return *this;
}